

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

int enumDotSkin(atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,atomBins *bbins,
               pointSet *dots,int srcFlag)

{
  int iVar1;
  atom *paVar2;
  bool bVar3;
  int iVar4;
  int local_4c;
  atomBins *local_48;
  atomBins *local_40;
  pointSet *local_38;
  
  bVar3 = bbins != (atomBins *)0x0 && allMovingAtoms != (atom *)0x0;
  iVar4 = 0;
  local_48 = bbins;
  local_40 = abins;
  local_38 = dots;
  for (; allMainAtoms != (atom *)0x0; allMainAtoms = allMainAtoms->next) {
    if ((allMainAtoms->flags & srcFlag) != 0) {
      paVar2 = findTouchingAtoms(allMainAtoms,(atom *)0x0,local_40,0.0,0,&local_4c);
      if (bVar3) {
        paVar2 = findTouchingAtoms(allMainAtoms,paVar2,local_48,0.0,0,&local_4c);
      }
      if ((paVar2 != (atom *)0x0) && (markBonds(allMainAtoms,paVar2,1,Maxbonded), 3 < Maxbonded)) {
        fixupLongBondChains(allMainAtoms,paVar2,3);
      }
      iVar1 = countSkin(allMainAtoms,paVar2,local_38);
      iVar4 = iVar1 + iVar4;
      if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
        fprintf(_stderr,"%s%s   \r",allMainAtoms->r->resname);
      }
    }
  }
  if (bVar3) {
    for (; allMovingAtoms != (atom *)0x0; allMovingAtoms = allMovingAtoms->next) {
      if ((allMovingAtoms->flags & srcFlag) != 0) {
        paVar2 = findTouchingAtoms(allMovingAtoms,(atom *)0x0,local_40,0.0,0,&local_4c);
        paVar2 = findTouchingAtoms(allMovingAtoms,paVar2,local_48,0.0,0,&local_4c);
        if ((paVar2 != (atom *)0x0) && (markBonds(allMovingAtoms,paVar2,1,Maxbonded), 3 < Maxbonded)
           ) {
          fixupLongBondChains(allMovingAtoms,paVar2,3);
        }
        iVar1 = countSkin(allMovingAtoms,paVar2,local_38);
        iVar4 = iVar1 + iVar4;
        if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
          fprintf(_stderr,"%s%s   \r",allMovingAtoms->r->resname);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int enumDotSkin(atom *allMainAtoms, atomBins *abins,
	    atom *allMovingAtoms, atomBins *bbins,
	    pointSet dots[], int srcFlag)
{
   atom *src = NULL, *atomList = NULL, *atomList2 = NULL;
   int dotTotal = 0, usesMovingAtoms = FALSE;
   int dummy = TRUE;

         /*numSkinDots used to normalize output score*/

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));

   for(src = allMainAtoms; src; src = src->next) {
      if (src->flags & srcFlag) {

	 atomList  = findTouchingAtoms(src, NULL,     abins, 0.0, 0, &dummy);
	 if (usesMovingAtoms) {
	    atomList2 = findTouchingAtoms(src, atomList, bbins, 0.0, 0, &dummy);
	 }
	 else { atomList2 = atomList; }

	 if (atomList2) {
	    markBonds(src, atomList2, 1, Maxbonded); /*in enumDotSkin()*/
	    if (Maxbonded > 3) { fixupLongBondChains(src, atomList2, 3); }
	 }
	 dotTotal += countSkin(src, atomList2, dots);

	 if(Verbose && ShowTicks) {
	    fprintf(stderr, "%s%s   \r",
	               src->r->resname, src->r->Hy36resno);
	 }
      }
   }

   if (usesMovingAtoms) {
      for(src = allMovingAtoms; src; src = src->next) {
	 if (src->flags & srcFlag) {

	    atomList  = findTouchingAtoms(src, NULL,     abins, 0.0, 0, &dummy);
	    atomList2 = findTouchingAtoms(src, atomList, bbins, 0.0, 0, &dummy);
	    if (atomList2) {
	       markBonds(src, atomList2, 1, Maxbonded); /*in enumDotSkin()*/
	       if (Maxbonded > 3) { fixupLongBondChains(src, atomList2, 3); }
	    }
	    dotTotal += countSkin(src, atomList2, dots);

	    if(Verbose && ShowTicks) {
	       fprintf(stderr, "%s%s   \r",
	               src->r->resname, src->r->Hy36resno);
	    }
	 }
      }
   }
   return dotTotal;
}